

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

void Gia_ManIncrSimSet(Gia_Man_t *p,Vec_Int_t *vObjLits)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  word *p_01;
  Gia_Obj_t *pObj;
  int local_54;
  word *pSims;
  int iLit;
  int i;
  Vec_Int_t *vObjLits_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vObjLits);
  if (0 < iVar1) {
    p->iTimeStamp = p->iTimeStamp + 1;
    for (pSims._4_4_ = 0; iVar1 = Vec_IntSize(vObjLits), pSims._4_4_ < iVar1;
        pSims._4_4_ = pSims._4_4_ + 1) {
      iVar1 = Vec_IntEntry(vObjLits,pSims._4_4_);
      iVar2 = Abc_Lit2Var(iVar1);
      p_01 = Gia_ManBuiltInData(p,iVar2);
      iVar2 = Abc_Lit2Var(iVar1);
      pObj = Gia_ManObj(p,iVar2);
      iVar2 = Gia_ObjIsAnd(pObj);
      if (iVar2 == 0) {
        p_00 = p->vTimeStamps;
        iVar2 = Abc_Lit2Var(iVar1);
        Vec_IntWriteEntry(p_00,iVar2,p->iTimeStamp);
        iVar2 = Abc_TtGetBit(p_01,p->iPatsPi);
        iVar1 = Abc_LitIsCompl(iVar1);
        if (iVar2 == iVar1) {
          Abc_TtXorBit(p_01,p->iPatsPi);
        }
      }
    }
    if (p->iPatsPi == p->nSimWords * 0x40 + -1) {
      local_54 = 0;
    }
    else {
      local_54 = p->iPatsPi + 1;
    }
    p->iPatsPi = local_54;
    return;
  }
  __assert_fail("Vec_IntSize(vObjLits) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                ,0x499,"void Gia_ManIncrSimSet(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

void Gia_ManIncrSimSet( Gia_Man_t * p, Vec_Int_t * vObjLits )
{
    int i, iLit; 
    assert( Vec_IntSize(vObjLits) > 0 );
    p->iTimeStamp++;
    Vec_IntForEachEntry( vObjLits, iLit, i )
    {
        word * pSims = Gia_ManBuiltInData( p, Abc_Lit2Var(iLit) );
        if ( Gia_ObjIsAnd(Gia_ManObj(p, Abc_Lit2Var(iLit))) )
            continue;
        //assert( Vec_IntEntry(p->vTimeStamps, Abc_Lit2Var(iLit)) == p->iTimeStamp-1 );
        Vec_IntWriteEntry(p->vTimeStamps, Abc_Lit2Var(iLit), p->iTimeStamp);
        if ( Abc_TtGetBit(pSims, p->iPatsPi) == Abc_LitIsCompl(iLit) )
             Abc_TtXorBit(pSims, p->iPatsPi);
    }
    p->iPatsPi = (p->iPatsPi == p->nSimWords * 64 - 1) ? 0 : p->iPatsPi + 1;
}